

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_thunder.c
# Opt level: O2

int ThunderDecodeRow(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (occ % tif->tif_scanlinesize == 0) {
    for (; iVar1 = 1, 0 < occ; occ = occ - tif->tif_scanlinesize) {
      uVar3 = (ulong)(tif->tif_dir).td_imagewidth;
      if ((0 < tif->tif_rawcc) && (uVar3 != 0)) {
        iVar1 = (*(code *)(&DAT_002eb3b0 +
                          *(int *)(&DAT_002eb3b0 + (ulong)(*tif->tif_rawcp >> 6) * 4)))();
        return iVar1;
      }
      tif->tif_rawcp = tif->tif_rawcp;
      tif->tif_rawcc = tif->tif_rawcc;
      if (uVar3 != 0) {
        pcVar2 = "Too much";
        if (uVar3 != 0) {
          pcVar2 = "Not enough";
        }
        TIFFErrorExtR(tif,"ThunderDecode","%s data at scanline %lu (%lu != %lu)",pcVar2,
                      (ulong)tif->tif_row,0,uVar3,tif,buf,occ,uVar3);
        return 0;
      }
      buf = buf + tif->tif_scanlinesize;
    }
  }
  else {
    iVar1 = 0;
    TIFFErrorExtR(tif,"ThunderDecodeRow","Fractional scanlines cannot be read");
  }
  return iVar1;
}

Assistant:

static int ThunderDecodeRow(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "ThunderDecodeRow";
    uint8_t *row = buf;

    (void)s;
    if (occ % tif->tif_scanlinesize)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    while (occ > 0)
    {
        if (!ThunderDecode(tif, row, tif->tif_dir.td_imagewidth))
            return (0);
        occ -= tif->tif_scanlinesize;
        row += tif->tif_scanlinesize;
    }
    return (1);
}